

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleGetMultisamplefvTests.cpp
# Opt level: O0

void __thiscall
glcts::MultisampleTextureGetMultisamplefvNullValArgumentsAcceptedTest::deinit
          (MultisampleTextureGetMultisamplefvNullValArgumentsAcceptedTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  MultisampleTextureGetMultisamplefvNullValArgumentsAcceptedTest *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x78))(0x8ca9,0);
  (**(code **)(lVar3 + 0xb8))(0x9100,0);
  if (this->to_2d_multisample_id != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->to_2d_multisample_id);
    this->to_2d_multisample_id = 0;
  }
  if (this->fbo_id != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->fbo_id);
    this->fbo_id = 0;
  }
  return;
}

Assistant:

void MultisampleTextureGetMultisamplefvNullValArgumentsAcceptedTest::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Unbind framebuffer object bound to GL_DRAW_FRAMEBUFFER target */
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);

	/* Unbind texture object bound to GL_TEXTURE_2D_MULTISAMPLE texture target */
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, 0);

	/* Delete a 2D multisample texture object of id to_2d_multisample_id */
	if (to_2d_multisample_id != 0)
	{
		gl.deleteTextures(1, &to_2d_multisample_id);

		to_2d_multisample_id = 0;
	}

	/* Delete a framebuffer object of id fbo_id */
	if (fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &fbo_id);

		fbo_id = 0;
	}
}